

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_lower.c
# Opt level: O0

void process_expression(CompilerState *compiler_state,AstNode *node)

{
  AstNode *node_local;
  CompilerState *compiler_state_local;
  
  switch(node->type) {
  case EXPR_LITERAL:
    break;
  case EXPR_SYMBOL:
    break;
  case EXPR_Y_INDEX:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    break;
  case EXPR_FIELD_SELECTOR:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    break;
  case EXPR_TABLE_ELEMENT_ASSIGN:
    if ((node->field_2).function_stmt.function_expr != (AstNode *)0x0) {
      process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    }
    process_expression(compiler_state,(node->field_2).binary_expr.expr_right);
    break;
  case EXPR_SUFFIXED:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    if ((node->field_2).for_stmt.for_statement_list != (AstNodeList *)0x0) {
      process_expression_list(compiler_state,(node->field_2).for_stmt.for_statement_list);
    }
    break;
  case EXPR_UNARY:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    break;
  case EXPR_BINARY:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    process_expression(compiler_state,(node->field_2).binary_expr.expr_right);
    break;
  case EXPR_FUNCTION:
    process_statement_list(compiler_state,(node->field_2).function_expr.function_statement_list);
    break;
  case EXPR_TABLE_LITERAL:
    process_expression_list(compiler_state,(node->field_2).table_expr.expr_list);
    break;
  case EXPR_FUNCTION_CALL:
    process_expression_list(compiler_state,(node->field_2).for_stmt.for_statement_list);
    break;
  case EXPR_CONCAT:
    process_expression_list(compiler_state,(node->field_2).table_expr.expr_list);
    break;
  case EXPR_BUILTIN:
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_lower.c"
                  ,0x56,"void process_expression(CompilerState *, AstNode *)");
  }
  return;
}

Assistant:

static void process_expression(CompilerState *compiler_state, AstNode *node)
{
	switch (node->type) {
	case EXPR_FUNCTION:
		process_statement_list(compiler_state, node->function_expr.function_statement_list);
		break;
	case EXPR_SUFFIXED:
		process_expression(compiler_state, node->suffixed_expr.primary_expr);
		if (node->suffixed_expr.suffix_list) {
			process_expression_list(compiler_state, node->suffixed_expr.suffix_list);
		}
		break;
	case EXPR_FUNCTION_CALL:
		process_expression_list(compiler_state, node->function_call_expr.arg_list);
		break;
	case EXPR_SYMBOL:
		break;
	case EXPR_BINARY:
		process_expression(compiler_state, node->binary_expr.expr_left);
		process_expression(compiler_state, node->binary_expr.expr_right);
		break;
	case EXPR_CONCAT:
		process_expression_list(compiler_state, node->string_concatenation_expr.expr_list);
		break;
	case EXPR_UNARY:
		process_expression(compiler_state, node->unary_expr.expr);
		break;
	case EXPR_LITERAL:
		break;
	case EXPR_FIELD_SELECTOR:
		process_expression(compiler_state, node->index_expr.expr);
		break;
	case EXPR_Y_INDEX:
		process_expression(compiler_state, node->index_expr.expr);
		break;
	case EXPR_TABLE_ELEMENT_ASSIGN:
		if (node->table_elem_assign_expr.key_expr) {
			process_expression(compiler_state, node->table_elem_assign_expr.key_expr);
		}
		process_expression(compiler_state, node->table_elem_assign_expr.value_expr);
		break;
	case EXPR_TABLE_LITERAL:
		process_expression_list(compiler_state, node->table_expr.expr_list);
		break;
	case EXPR_BUILTIN:
		break;
	default:
		assert(0);
		break;
	}
}